

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

void SuperSpread_Test_Hitter<4u>(string *PATH)

{
  bool bVar1;
  int iVar2;
  value_type pbVar3;
  reference ppbVar4;
  unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
  *puVar5;
  unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
  *this;
  OpenSketch<4U> *this_00;
  void *pvVar6;
  ostream *poVar7;
  int *piVar8;
  mapped_type *pmVar9;
  reference ppbVar10;
  unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
  *this_01;
  ofstream *in_stack_fffffffffffff998;
  OLF<4U> *this_02;
  int in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  TLF<4U> *in_stack_fffffffffffff9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  long *plVar11;
  allocator_type *in_stack_fffffffffffff9c0;
  mapped_type *in_stack_fffffffffffff9c8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2_1;
  int j_4;
  int j_3;
  ofstream out;
  undefined1 local_360 [56];
  int local_328;
  int local_324;
  int j_2;
  int j_1;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_318;
  _Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true> local_310;
  _Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true> local_308;
  Stream<4U> local_2fc;
  Stream<4U> stream;
  int num;
  Data<4U> to;
  Data<4U> from;
  Data<4U> *records;
  int cnt;
  StreamMap<4U> sp;
  HashMap<4U> mp;
  basic_ostream<char,_std::char_traits<char>_> **out_2;
  iterator __end2;
  iterator __begin2;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  uint32_t j;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  iterator __end3;
  iterator __begin3;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range3;
  unsigned_long __vla_expr0;
  int SKETCH_NUM;
  int memory;
  int i;
  string local_1e0 [32];
  string local_1c0 [39];
  undefined1 local_199;
  string local_198 [32];
  string local_178 [32];
  string local_158 [39];
  undefined1 local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [39];
  undefined1 local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [39];
  allocator local_61;
  string local_60 [8];
  string file;
  undefined1 local_28 [8];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  string *PATH_local;
  
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)PATH;
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d956);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            *)in_stack_fffffffffffff9d0._M_cur,(size_type)in_stack_fffffffffffff9c8,
           in_stack_fffffffffffff9c0);
  std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>::~allocator
            ((allocator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)0x10d976);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"caida",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pbVar3 = (value_type)operator_new(0x200);
  local_c9 = 1;
  std::operator+(in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0._M_cur);
  std::operator+(in_stack_fffffffffffff9b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::ofstream(pbVar3,local_88,0x10);
  local_c9 = 0;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,0);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  pbVar3 = (value_type)operator_new(0x200);
  local_131 = 1;
  std::operator+(in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0._M_cur);
  std::operator+(in_stack_fffffffffffff9b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::ofstream(pbVar3,local_f0,0x10);
  local_131 = 0;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,1);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  pbVar3 = (value_type)operator_new(0x200);
  local_199 = 1;
  std::operator+(in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0._M_cur);
  std::operator+(in_stack_fffffffffffff9b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::ofstream(pbVar3,local_158,0x10);
  local_199 = 0;
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,2);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  pbVar3 = (value_type)operator_new(0x200);
  std::operator+(in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0._M_cur);
  std::operator+(in_stack_fffffffffffff9b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9b0);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  std::ofstream::ofstream(pbVar3,local_1c0,0x10);
  ppbVar4 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[]((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)local_28,3);
  *ppbVar4 = pbVar3;
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&i);
  for (SKETCH_NUM = 0; SKETCH_NUM < 5; SKETCH_NUM = SKETCH_NUM + 1) {
    iVar2 = SKETCH_NUM * 100000 + 600000;
    this_02 = (OLF<4U> *)0x10dd17;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m",(ulong)(uint)(iVar2 / 1000));
    puVar5 = (unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
              *)operator_new(0xa8);
    WavingSketch<8U,_16U,_4U>::WavingSketch
              ((WavingSketch<8U,_16U,_4U> *)in_stack_fffffffffffff9d0._M_cur,
               (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(int)in_stack_fffffffffffff9c8,
               (uint32_t)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
    this_01 = puVar5;
    this = (unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
            *)operator_new(0x120);
    TLF<4U>::TLF(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8);
    this_00 = (OpenSketch<4U> *)operator_new(0xe8);
    OLF<4U>::OLF(this_02,(int)((ulong)in_stack_fffffffffffff998 >> 0x20),
                 (int)in_stack_fffffffffffff998);
    pvVar6 = operator_new(0xd0);
    OpenSketch<4U>::OpenSketch(this_00,(int)((ulong)pvVar6 >> 0x20),(int)pvVar6);
    in_stack_fffffffffffff998 = (ofstream *)operator_new(0x78);
    SpreadSketchWrapper<4U>::SpreadSketchWrapper
              ((SpreadSketchWrapper<4U> *)in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,
               in_stack_fffffffffffff9a8);
    if (SKETCH_NUM == 0) {
      __end3 = std::
               vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        *)this_01);
      std::
      vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
      ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                 *)this,(__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                         *)this_01), bVar1) {
        ppbVar10 = __gnu_cxx::
                   __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                   ::operator*(&__end3);
        poVar7 = std::operator<<((ostream *)*ppbVar10,"MEM(KB)");
        std::operator<<(poVar7,",");
        for (__range2._4_4_ = 0; __range2._4_4_ < 5; __range2._4_4_ = __range2._4_4_ + 1) {
          poVar7 = std::operator<<((ostream *)*ppbVar10,
                                   (string *)
                                   (*(long *)((long)&stack0xfffffffffffff978 +
                                             (ulong)__range2._4_4_ * 2 * 4) + 8));
          std::operator<<(poVar7,",");
        }
        std::ostream::operator<<((ostream *)*ppbVar10,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
        ::operator++(&__end3);
      }
    }
    __end2 = std::
             vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                      *)this_01);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this,(__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                       *)this_01), bVar1) {
      ppbVar10 = __gnu_cxx::
                 __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                 ::operator*(&__end2);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar10,iVar2 / 1000);
      std::operator<<(poVar7,",");
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&__end2);
    }
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                     *)0x10e36d);
    std::
    unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
    ::unordered_map((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                     *)0x10e379);
    std::__cxx11::string::c_str();
    _to = read_standard_pair_data<4u>
                    ((char *)pbVar3,(int)((ulong)puVar5 >> 0x20),(int *)&stack0xfffffffffffff978);
    Data<4U>::Data((Data<4U> *)0x10e3bd);
    Data<4U>::Data((Data<4U> *)0x10e3cb);
    stream.str[0] = '\0';
    stream.str[1] = '\0';
    stream.str[2] = '\0';
    stream.str[3] = '\0';
    piVar8 = std::min<int>((int *)((long)&records + 4),&MAX_PACKET);
    records._4_4_ = *piVar8;
    for (; (int)stream.str._0_4_ < records._4_4_; stream.str._0_4_ = stream.str._0_4_ + 1) {
      Data<4U>::operator=((Data<4U> *)&num,_to + stream.str._0_4_ * 2);
      Data<4U>::operator=((Data<4U> *)(stream.str + 4),_to + (long)(stream.str._0_4_ * 2) + 1);
      Stream<4U>::Stream(&local_2fc,(Data<4U> *)&num,(Data<4U> *)(stream.str + 4));
      local_308._M_cur =
           (__node_type *)
           std::
           unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
           ::find(this_01,(key_type *)0x10e48c);
      local_310._M_cur =
           (__node_type *)
           std::
           unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
           ::end(this_01);
      bVar1 = std::__detail::operator==(&local_308,&local_310);
      if (bVar1) {
        pmVar9 = std::
                 unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                 ::operator[](this,(key_type *)this_01);
        *pmVar9 = 1;
        in_stack_fffffffffffff9d0._M_cur =
             (__node_type *)
             std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::find((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                     *)this_01,(key_type *)0x10e50e);
        local_318._M_cur = in_stack_fffffffffffff9d0._M_cur;
        _j_2 = (__node_type *)
               std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::end((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                      *)this_01);
        bVar1 = std::__detail::operator==
                          (&local_318,
                           (_Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> *)&j_2);
        if (bVar1) {
          in_stack_fffffffffffff9c8 =
               std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)this,(key_type *)this_01);
          *in_stack_fffffffffffff9c8 = 1;
        }
        else {
          in_stack_fffffffffffff9c0 =
               (allocator_type *)
               std::
               unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
               ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                             *)this,(key_type *)this_01);
          *(int *)in_stack_fffffffffffff9c0 = *(int *)in_stack_fffffffffffff9c0 + 1;
        }
      }
      for (local_324 = 0; local_324 < 5; local_324 = local_324 + 1) {
        plVar11 = *(long **)((long)&stack0xfffffffffffff978 + (long)local_324 * 2 * 4);
        (**(code **)(*plVar11 + 0x28))(plVar11,&num,stream.str + 4);
      }
    }
    free(_to);
    for (local_328 = 0; local_328 < 5; local_328 = local_328 + 1) {
      plVar11 = *(long **)((long)&stack0xfffffffffffff978 + (long)local_328 * 2 * 4);
      std::
      unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
      ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                       *)this,(unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                               *)this_01);
      (**(code **)(*plVar11 + 0x30))(plVar11,local_360,local_28);
      std::
      unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
      ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                        *)0x10e6a2);
    }
    std::ofstream::ofstream(&j_4);
    for (__range2_1._4_4_ = 0; __range2_1._4_4_ < 5; __range2_1._4_4_ = __range2_1._4_4_ + 1) {
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      Abstract<4U>::print_f1
                (&this_02->super_Abstract<4U>,in_stack_fffffffffffff998,(int)((ulong)pvVar6 >> 0x20)
                );
    }
    for (__range2_1._0_4_ = 0; (int)__range2_1 < 5; __range2_1._0_4_ = (int)__range2_1 + 1) {
      in_stack_fffffffffffff9b0 =
           *(TLF<4U> **)((long)&stack0xfffffffffffff978 + (long)(int)__range2_1 * 2 * 4);
      if (in_stack_fffffffffffff9b0 != (TLF<4U> *)0x0) {
        (*(in_stack_fffffffffffff9b0->super_Abstract<4U>)._vptr_Abstract[9])();
      }
    }
    __end2_1 = std::
               vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
               ::begin((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                        *)this_01);
    std::
    vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::end((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                               *)this,(__normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                                       *)this_01), bVar1) {
      ppbVar10 = __gnu_cxx::
                 __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
                 ::operator*(&__end2_1);
      std::ostream::operator<<((ostream *)*ppbVar10,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::basic_ostream<char,_std::char_traits<char>_>_**,_std::vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>_>
      ::operator++(&__end2_1);
    }
    std::ofstream::~ofstream(&j_4);
    std::
    unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
    ::~unordered_map((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                      *)0x10e850);
    std::
    unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
    ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                      *)0x10e85c);
  }
  std::__cxx11::string::~string(local_60);
  std::
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::~vector((vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             *)in_stack_fffffffffffff9c0);
  return;
}

Assistant:

void SuperSpread_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 5;
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, SuperSpread_HIT);
		sketch[1] = new TLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[2] = new OLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[3] = new OpenSketch<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[4] = new SpreadSketchWrapper<DATA_LEN>(memory, SuperSpread_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		HashMap<DATA_LEN> mp;
		StreamMap<DATA_LEN> sp;

		int cnt;
		Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
		Data<DATA_LEN> from;
		Data<DATA_LEN> to;
		int num = 0;
		cnt = std::min(cnt, MAX_PACKET);
		while (num < cnt) {
			from = records[num * 2];
			to = records[num * 2 + 1];

			/*
			num++;
			if(num % 1000000 == 0){
				cout << num << endl;
			}
			*/

			Stream<DATA_LEN> stream(from, to);
			if (sp.find(stream) == sp.end()) {
				sp[stream] = 1;
				if (mp.find(from) == mp.end())
					mp[from] = 1;
				else
					mp[from] += 1;
			}
			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(from, to);
			}
			num++;
		}
		free(records);
		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}